

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_classes(CHAR_DATA *ch,char *argument)

{
  const_reference pvVar1;
  CClass *pCVar2;
  char *pcVar3;
  int iClass;
  int iRace;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffedd8;
  int in_stack_ffffffffffffede0;
  int iVar4;
  CHAR_DATA local_1218 [5];
  
  iVar4 = 1;
  while ((pvVar1 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                             (&race_table,(long)iVar4), pvVar1->name != (char *)0x0 &&
         (pvVar1 = std::vector<race_type,_std::allocator<race_type>_>::operator[]
                             (&race_table,(long)iVar4), (pvVar1->pc_race & 1U) != 0))) {
    in_stack_ffffffffffffedd8 = local_1218;
    pvVar1 = std::vector<race_type,_std::allocator<race_type>_>::operator[](&race_table,(long)iVar4)
    ;
    sprintf((char *)in_stack_ffffffffffffedd8,"\n\r%s:\n\r",pvVar1->name);
    send_to_char((char *)CONCAT44(iVar4,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8);
    for (in_stack_ffffffffffffede0 = 1; in_stack_ffffffffffffede0 < 0xc;
        in_stack_ffffffffffffede0 = in_stack_ffffffffffffede0 + 1) {
      if (*(short *)((long)iVar4 * 0x88 + 0x921158 + (long)in_stack_ffffffffffffede0 * 2) == 1) {
        pCVar2 = CClass::GetClass(in_stack_ffffffffffffede0);
        pcVar3 = RString::operator_cast_to_char_(&pCVar2->name);
        sprintf((char *)local_1218,"%s ",pcVar3);
        send_to_char((char *)CONCAT44(iVar4,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8);
      }
    }
    iVar4 = iVar4 + 1;
  }
  send_to_char((char *)CONCAT44(iVar4,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8);
  return;
}

Assistant:

void do_classes(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	int iRace;
	int iClass;

	for (iRace = 1; race_table[iRace].name != nullptr; iRace++)
	{
		if (!race_table[iRace].pc_race)
			break;

		sprintf(buf, "\n\r%s:\n\r", race_table[iRace].name);
		send_to_char(buf, ch);

		for (iClass = 1; iClass < MAX_CLASS; iClass++)
		{
			if (pc_race_table[iRace].classes[iClass] == 1)
			{
				sprintf(buf, "%s ", (RSTR)CClass::GetClass(iClass)->name);
				send_to_char(buf, ch);
			}
		}
	}

	send_to_char("\n\r", ch);
}